

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

void __thiscall xemmai::ast::t_object_get::f_method(t_object_get *this,t_emit *a_emit)

{
  pointer ptVar1;
  t_emit *ptVar2;
  t_emit *a_emit_local;
  t_object_get *this_local;
  
  ptVar1 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
           operator->(&this->v_target);
  (*ptVar1->_vptr_t_node[3])(ptVar1,a_emit,0,0);
  t_emit::f_emit_safe_point(a_emit,&this->super_t_node);
  t_emit::f_pop(a_emit);
  ptVar2 = t_emit::operator<<(a_emit,c_instruction__METHOD_GET);
  ptVar2 = t_emit::operator<<(ptVar2,a_emit->v_stack);
  ptVar2 = t_emit::operator<<(ptVar2,this->v_key);
  t_emit::operator<<(ptVar2,0);
  ptVar2 = t_emit::f_push(a_emit);
  t_emit::f_push(ptVar2);
  t_emit::f_at(a_emit,&this->super_t_node);
  return;
}

Assistant:

void t_object_get::f_method(t_emit& a_emit)
{
	v_target->f_emit(a_emit, false, false);
	a_emit.f_emit_safe_point(this);
	a_emit.f_pop();
	a_emit << c_instruction__METHOD_GET << a_emit.v_stack << v_key << 0;
	a_emit.f_push().f_push();
	a_emit.f_at(this);
}